

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

anm_archive_t * anm_create(char *spec,FILE *symbolfp,uint version)

{
  long lVar1;
  list_node_t *plVar2;
  anm_script_t *script_00;
  void *__ptr;
  char *pcVar3;
  bool bVar4;
  FILE *__stream;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  anm_script_t *local_160;
  list_node_t *node_6;
  global_t *global;
  list_node_t *node_5;
  list_node_t *node_4;
  symbol_id_pair_t *symbol;
  list_node_t *node_3;
  var_t *var;
  list_node_t *node_2;
  anm_script_t *script;
  list_node_t *node_1;
  int found;
  char *name;
  list_node_t *node;
  anm_entry_t *entry;
  anm_archive_t *anm;
  parser_state_t state;
  FILE *in;
  uint version_local;
  FILE *symbolfp_local;
  char *spec_local;
  
  state._176_8_ = fopen(spec,"r");
  __stream = _stderr;
  pcVar3 = argv0;
  if ((FILE *)state._176_8_ == (FILE *)0x0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    fprintf(__stream,"%s: couldn\'t open %s for reading: %s\n",pcVar3,spec,pcVar7);
    exit(1);
  }
  iVar5 = anm_is_old_format((FILE *)state._176_8_);
  if (iVar5 == 0) {
    anm._0_4_ = 0;
    anm._4_2_ = 0;
    state.was_error = -1;
    state.time = -1;
    state._6_2_ = 0xffff;
    state.current_version = 0;
    state.offset = 0;
    state.sprite_id = 0;
    list_init((list_t *)&state.script_id);
    list_init((list_t *)&state.current_script);
    list_init((list_t *)&state.sprite_names.tail);
    list_init((list_t *)&state.globals.tail);
    state.entries.tail = (list_node_t *)0x0;
    state.current_entry = (anm_entry_t *)0x0;
    state.symbol_prefix._24_8_ = symbolfp;
    strcpy((char *)&state.path_state.path_list.tail,"");
    state.symbolfp._0_4_ = version;
    path_init((path_state_t *)&state.script_names.tail,spec,argv0);
    thanm_yyin = (FILE *)state._176_8_;
    iVar5 = thanm_yyparse((parser_state_t *)&anm);
    if ((iVar5 == 0) && ((int)anm == 0)) {
      path_free((path_state_t *)&state.script_names.tail);
      spec_local = (char *)util_malloc(0x30);
      spec_local[0] = '\0';
      spec_local[1] = '\0';
      spec_local[2] = '\0';
      spec_local[3] = '\0';
      spec_local[4] = '\0';
      spec_local[5] = '\0';
      spec_local[6] = '\0';
      spec_local[7] = '\0';
      spec_local[8] = '\0';
      spec_local[9] = '\0';
      spec_local[10] = '\0';
      spec_local[0xb] = '\0';
      spec_local[0xc] = '\0';
      spec_local[0xd] = '\0';
      spec_local[0xe] = '\0';
      spec_local[0xf] = '\0';
      list_init((list_t *)(spec_local + 0x10));
      *(undefined8 *)(spec_local + 0x20) = state._24_8_;
      *(list_node_t **)(spec_local + 0x28) = state.entries.head;
      for (name = *(char **)(spec_local + 0x20); name != (char *)0x0; name = *(char **)name) {
        lVar1 = *(long *)(name + 0x10);
        bVar4 = false;
        for (script = *(anm_script_t **)(spec_local + 0x10); script != (anm_script_t *)0x0;
            script = *(anm_script_t **)script) {
          plVar2 = (script->instrs).head;
          iVar5 = strcmp(*(char **)(lVar1 + 0x10),(char *)plVar2);
          if (iVar5 == 0) {
            free(*(void **)(lVar1 + 0x10));
            *(list_node_t **)(lVar1 + 0x10) = plVar2;
            bVar4 = true;
            break;
          }
        }
        if (!bVar4) {
          list_append_new((list_t *)(spec_local + 0x10),*(void **)(lVar1 + 0x10));
        }
        for (var = *(var_t **)(lVar1 + 0x48); var != (var_t *)0x0; var = (var_t *)var->name) {
          script_00 = (anm_script_t *)var->reg;
          anm_serialize_script((parser_state_t *)&anm,script_00);
          for (symbol = (symbol_id_pair_t *)(script_00->vars).head;
              symbol != (symbol_id_pair_t *)0x0; symbol = *(symbol_id_pair_t **)symbol) {
            var_free(*(var_t **)(symbol + 1));
          }
          list_free_nodes(&script_00->vars);
        }
      }
      reg_free_user();
      for (node_5 = state.globals.tail; node_5 != (list_node_t *)0x0; node_5 = node_5->next) {
        __ptr = node_5->data;
        free(*(void **)((long)__ptr + 8));
        free(__ptr);
      }
      list_free_nodes((list_t *)&state.globals.tail);
      for (global = (global_t *)state.sprite_names.tail; global != (global_t *)0x0;
          global = (global_t *)global->name) {
        pcVar3 = global[1].name;
        free(*(void **)(pcVar3 + 8));
        free(pcVar3);
      }
      list_free_nodes((list_t *)&state.sprite_names.tail);
      for (local_160 = state.current_script; local_160 != (anm_script_t *)0x0;
          local_160 = *(anm_script_t **)local_160) {
        plVar2 = (local_160->instrs).head;
        free(plVar2->next);
        thanm_param_free((thanm_param_t *)plVar2->prev);
      }
      list_free_nodes((list_t *)&state.current_script);
    }
    else {
      spec_local = (char *)0x0;
    }
  }
  else {
    fprintf(_stderr,
            "%s: %s: the spec file was made using an old version\nof thanm and uses the old format, which is no longer supported.\nPlease use the old version of thanm to create the ANM file, and\nre-dump it using this version.\n"
            ,argv0,spec);
    spec_local = (char *)0x0;
  }
  return (anm_archive_t *)spec_local;
}

Assistant:

static anm_archive_t*
anm_create(
    char* spec,
    FILE* symbolfp,
    unsigned version
) {
    FILE* in = fopen(spec, "r");
    if (!in) {
        fprintf(stderr, "%s: couldn't open %s for reading: %s\n",
            argv0, spec, strerror(errno));
        exit(1);
    }
    if (anm_is_old_format(in)) {
        fprintf(stderr, "%s: %s: the spec file was made using an old version\n"
                        "of thanm and uses the old format, which is no longer supported.\n"
                        "Please use the old version of thanm to create the ANM file, and\n"
                        "re-dump it using this version.\n", argv0, spec);
        return NULL;
    }

    parser_state_t state;
    state.was_error = 0;
    state.time = 0;
    state.default_version = -1;
    state.current_version = -1;
    state.sprite_id = 0;
    state.script_id = 0;
    state.script_real_index = 0;
    list_init(&state.entries);
    list_init(&state.globals);
    list_init(&state.script_names);
    list_init(&state.sprite_names);
    state.current_entry = NULL;
    state.current_script = NULL;
    state.symbolfp = symbolfp;
    strcpy(state.symbol_prefix, "");
    state.version = version;

    path_init(&state.path_state, spec, argv0);

    thanm_yyin = in;
    if (thanm_yyparse(&state) || state.was_error)
        return NULL;

    path_free(&state.path_state);

    anm_archive_t* anm = (anm_archive_t*)util_malloc(sizeof(anm_archive_t));
    anm->map = NULL;
    anm->map_size = 0;
    list_init(&anm->names);
    anm->entries = state.entries;

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        char* name;
        int found = 0;
        list_for_each(&anm->names, name) {
            if (strcmp(entry->name, name) == 0) {
                free(entry->name);
                entry->name = name;
                found = 1;
                break;
            }
        }
        if (!found)
            list_append_new(&anm->names, entry->name);

        anm_script_t* script;
        list_for_each(&entry->scripts, script) {
            anm_serialize_script(&state, script);

            /* Free vars. */
            var_t* var;
            list_for_each(&script->vars, var) {
                var_free(var);
            }
            list_free_nodes(&script->vars);
        }
    }

    /* Free stuff. */
    reg_free_user();

    symbol_id_pair_t* symbol;
    list_for_each(&state.sprite_names, symbol) {
        free(symbol->name);
        free(symbol);
    }
    list_free_nodes(&state.sprite_names);

    list_for_each(&state.script_names, symbol) {
        free(symbol->name);
        free(symbol);
    }
    list_free_nodes(&state.script_names);

    global_t* global;
    list_for_each(&state.globals, global) {
        free(global->name);
        thanm_param_free(global->param);
    }
    list_free_nodes(&state.globals);

    return anm;
}